

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
               (Nonzero<double> *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<double> *pNVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Nonzero<double> *pNVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  
  if (end <= start + 1) {
    return;
  }
  uVar15 = end - 1;
LAB_001c0f4c:
  uVar5 = uVar15 - start;
  if ((int)uVar5 < 0x19) {
    if ((int)uVar5 < 1) {
      return;
    }
    SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
              (keys,uVar15,compare,start);
    return;
  }
  iVar6 = (uVar5 >> 1) + start;
  pNVar1 = keys + iVar6;
  dVar2 = keys[iVar6].val;
  lVar7 = (long)(int)uVar15;
  lVar8 = (long)start;
  uVar5 = uVar15;
  uVar11 = start;
  do {
    dVar3 = compare->epsiloncompare;
    uVar13 = (ulong)(int)uVar11;
    uVar12 = uVar15;
    if ((int)uVar15 < (int)uVar11) {
      uVar12 = uVar11;
    }
    if ((type & 1U) == 0) {
      lVar9 = (long)(int)uVar5;
      pNVar10 = keys + uVar13;
      for (; (long)uVar13 < lVar7; uVar13 = uVar13 + 1) {
        if ((dVar3 < ABS(pNVar10->val - dVar2)) && (dVar2 <= pNVar10->val)) {
          uVar12 = (uint)uVar13;
          break;
        }
        pNVar10 = pNVar10 + 1;
      }
      if (start <= (int)uVar5) {
        uVar5 = start;
      }
      pNVar10 = keys + lVar9;
      for (; lVar8 < lVar9; lVar9 = lVar9 + -1) {
        if ((ABS(pNVar10->val - dVar2) <= dVar3) || (pNVar10->val < dVar2)) {
          uVar5 = (uint)lVar9;
          break;
        }
        pNVar10 = pNVar10 + -1;
      }
    }
    else {
      for (pNVar10 = keys + uVar13;
          ((uVar14 = (ulong)uVar12, (long)uVar13 < lVar7 &&
           (uVar14 = uVar13, dVar3 < ABS(pNVar10->val - dVar2))) && (pNVar10->val < dVar2));
          pNVar10 = pNVar10 + 1) {
        uVar13 = uVar13 + 1;
      }
      uVar12 = (uint)uVar14;
      lVar9 = (long)(int)uVar5;
      if (start <= (int)uVar5) {
        uVar5 = start;
      }
      pNVar10 = keys + lVar9;
      for (; lVar8 < lVar9; lVar9 = lVar9 + -1) {
        if ((dVar3 < ABS(pNVar10->val - dVar2)) && (pNVar10->val < dVar2)) {
          uVar5 = (uint)lVar9;
          break;
        }
        pNVar10 = pNVar10 + -1;
      }
    }
    if ((int)uVar5 <= (int)uVar12) break;
    dVar3 = keys[(int)uVar12].val;
    iVar6 = keys[(int)uVar12].idx;
    keys[(int)uVar12].idx = keys[(int)uVar5].idx;
    keys[(int)uVar12].val = keys[(int)uVar5].val;
    keys[(int)uVar5].val = dVar3;
    keys[(int)uVar5].idx = iVar6;
    uVar11 = uVar12 + 1;
    uVar5 = uVar5 - 1;
  } while( true );
  if ((type & 1U) == 0) {
    lVar9 = (long)(int)uVar5;
    if (start <= (int)uVar5) {
      uVar5 = start;
    }
    pNVar10 = keys + lVar9;
    for (; lVar8 < lVar9; lVar9 = lVar9 + -1) {
      if ((dVar3 < ABS(dVar2 - pNVar10->val)) && (pNVar10->val <= dVar2)) {
        uVar5 = (uint)lVar9;
        break;
      }
      pNVar10 = pNVar10 + -1;
    }
    if (uVar5 == uVar15) {
      dVar2 = keys[lVar7].val;
      iVar6 = keys[lVar7].idx;
      keys[lVar7].idx = pNVar1->idx;
      keys[lVar7].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar6;
      uVar5 = uVar15 - 1;
    }
  }
  else {
    lVar9 = (long)(int)uVar12;
    if ((int)uVar12 <= (int)uVar15) {
      uVar12 = uVar15;
    }
    pNVar10 = keys + lVar9;
    for (; lVar9 < lVar7; lVar9 = lVar9 + 1) {
      if ((dVar3 < ABS(dVar2 - pNVar10->val)) && (dVar2 < pNVar10->val)) {
        uVar12 = (uint)lVar9;
        break;
      }
      pNVar10 = pNVar10 + 1;
    }
    if (uVar12 == start) {
      dVar2 = keys[lVar8].val;
      iVar6 = keys[lVar8].idx;
      keys[lVar8].idx = pNVar1->idx;
      keys[lVar8].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar6;
      uVar12 = start + 1;
    }
  }
  if ((int)(uVar15 - uVar12) < (int)(uVar5 - start)) {
    bVar4 = (int)uVar15 <= (int)uVar12;
    uVar11 = uVar5;
    uVar5 = uVar15;
    uVar15 = uVar12;
    uVar12 = start;
    if (bVar4) goto LAB_001c1206;
  }
  else {
    bVar4 = (int)uVar5 <= start;
    uVar11 = uVar15;
    uVar15 = start;
    start = uVar12;
    if (bVar4) goto LAB_001c1206;
  }
  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
            (keys,uVar5 + 1,compare,uVar15,(bool)(~type & 1));
  start = uVar12;
LAB_001c1206:
  uVar15 = uVar11;
  type = (bool)(type ^ 1);
  goto LAB_001c0f4c;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}